

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base_rock_sample.cpp
# Opt level: O1

bool __thiscall
despot::BaseRockSample::GetObservation
          (BaseRockSample *this,double rand_num,RockSampleState *rockstate,int rock)

{
  undefined8 uVar1;
  double dVar2;
  
  uVar1 = Grid<int>::GetCoord(&this->grid_,
                              *(int *)&rockstate->field_0xc >> ((byte)this->num_rocks_ & 0x1f));
  dVar2 = (double)despot::Coord::EuclideanDistance
                            (uVar1,*(undefined8 *)
                                    ((this->rock_pos_).
                                     super__Vector_base<despot::Coord,_std::allocator<despot::Coord>_>
                                     ._M_impl.super__Vector_impl_data._M_start + (long)rock * 8));
  dVar2 = exp2(-dVar2 / this->half_efficiency_distance_);
  return ((*(uint *)&rockstate->field_0xc >> (rock & 0x1fU) & 1) == 0) !=
         rand_num < (dVar2 + 1.0) * 0.5;
}

Assistant:

bool BaseRockSample::GetObservation(double rand_num,
	const RockSampleState& rockstate, int rock) const {
	double distance = Coord::EuclideanDistance(GetRobPos(&rockstate),
		rock_pos_[rock]);
	double efficiency = (1 + pow(2, -distance / half_efficiency_distance_))
		* 0.5;

	if (rand_num < efficiency)
		return GetRock(&rockstate, rock) & E_GOOD;
	else
		return !(GetRock(&rockstate, rock) & E_GOOD);
}